

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

Arguments * __thiscall
cmCoreTryCompile::ParseArgs
          (Arguments *__return_storage_ptr__,cmCoreTryCompile *this,
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *args,cmArgumentParser<cmCoreTryCompile::Arguments> *parser,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *unparsedArguments)

{
  pointer pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string m;
  string local_110;
  cmCoreTryCompile *local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_e8;
  undefined8 local_d0;
  char *local_c8;
  undefined8 local_c0;
  size_type local_b8;
  pointer local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  string local_88;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  Arguments::Arguments(__return_storage_ptr__,this->Makefile);
  cmArgumentParser<cmCoreTryCompile::Arguments>::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (parser,__return_storage_ptr__,args,unparsedArguments,0);
  bVar2 = ArgumentParser::ParseResult::MaybeReportError
                    (&__return_storage_ptr__->super_ParseResult,this->Makefile);
  if ((!bVar2) &&
     ((unparsedArguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (unparsedArguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_f0 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Unknown arguments:","");
    pbVar3 = (unparsedArguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (unparsedArguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar1) {
      do {
        local_e8.first._M_len = local_110._M_string_length;
        local_e8.first._M_str = local_110._M_dataplus._M_p;
        local_e8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_d0 = 4;
        local_c8 = "\n  \"";
        local_c0 = 0;
        local_b0 = (pbVar3->_M_dataplus)._M_p;
        local_b8 = pbVar3->_M_string_length;
        local_a8 = 0;
        local_68 = 0;
        local_60 = 1;
        local_50[0] = 0x22;
        local_a0 = 1;
        local_90 = 0;
        views._M_len = 4;
        views._M_array = &local_e8;
        local_98 = local_50;
        local_58 = local_50;
        cmCatViews(&local_88,views);
        std::__cxx11::string::operator=((string *)&local_110,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != pbVar1);
    }
    cmMakefile::IssueMessage(local_f0->Makefile,AUTHOR_WARNING,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Arguments cmCoreTryCompile::ParseArgs(
  const cmRange<std::vector<std::string>::const_iterator>& args,
  const cmArgumentParser<Arguments>& parser,
  std::vector<std::string>& unparsedArguments)
{
  Arguments arguments{ this->Makefile };
  parser.Parse(arguments, args, &unparsedArguments, 0);
  if (!arguments.MaybeReportError(*(this->Makefile)) &&
      !unparsedArguments.empty()) {
    std::string m = "Unknown arguments:";
    for (const auto& i : unparsedArguments) {
      m = cmStrCat(m, "\n  \"", i, '"');
    }
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, m);
  }
  return arguments;
}